

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O0

string * efsw::Platform::System::getProcessPath_abi_cxx11_(void)

{
  ssize_t sVar1;
  char *pcVar2;
  string *in_RDI;
  allocator local_1051;
  string local_1050 [51];
  allocator local_101d;
  int local_101c;
  char local_1018 [4];
  int size;
  char exe_file [4097];
  
  sVar1 = readlink("/proc/self/exe",local_1018,0x1000);
  local_101c = (int)sVar1;
  if (local_101c < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"./",&local_101d);
    std::allocator<char>::~allocator((allocator<char> *)&local_101d);
  }
  else {
    local_1018[local_101c] = '\0';
    pcVar2 = dirname(local_1018);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1050,pcVar2,&local_1051);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)local_1050);
    std::__cxx11::string::~string(local_1050);
    std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  }
  return in_RDI;
}

Assistant:

std::string System::getProcessPath() {
#if EFSW_OS == EFSW_OS_MACOSX
	char exe_file[FILENAME_MAX + 1];

	CFBundleRef mainBundle = CFBundleGetMainBundle();

	if ( mainBundle ) {
		CFURLRef mainURL = CFBundleCopyBundleURL( mainBundle );

		if ( mainURL ) {
			int ok = CFURLGetFileSystemRepresentation( mainURL, ( Boolean ) true, (UInt8*)exe_file,
													   FILENAME_MAX );

			if ( ok ) {
				return std::string( exe_file ) + "/";
			}
		}
	}

	return "./";
#elif EFSW_OS == EFSW_OS_LINUX
	char exe_file[FILENAME_MAX + 1];

	int size;

	size = readlink( "/proc/self/exe", exe_file, FILENAME_MAX );

	if ( size < 0 ) {
		return std::string( "./" );
	} else {
		exe_file[size] = '\0';
		return std::string( dirname( exe_file ) ) + "/";
	}

#elif EFSW_OS == EFSW_OS_BSD
	int mib[4];
	mib[0] = CTL_KERN;
	mib[1] = KERN_PROC;
	mib[2] = KERN_PROC_PATHNAME;
	mib[3] = -1;
	char buf[1024];
	size_t cb = sizeof( buf );
	sysctl( mib, 4, buf, &cb, NULL, 0 );

	return FileSystem::pathRemoveFileName( std::string( buf ) );

#elif EFSW_OS == EFSW_OS_SOLARIS
	return FileSystem::pathRemoveFileName( std::string( getexecname() ) );

#elif EFSW_OS == EFSW_OS_HAIKU
	image_info info;
	int32 cookie = 0;

	while ( B_OK == get_next_image_info( 0, &cookie, &info ) ) {
		if ( info.type == B_APP_IMAGE )
			break;
	}

	return FileSystem::pathRemoveFileName( std::string( info.name ) );

#elif EFSW_OS == EFSW_OS_ANDROID
	return "/sdcard/";

#else
#warning getProcessPath() not implemented on this platform. ( will return "./" )
	return "./";

#endif
}